

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O1

ostream * operator<<(ostream *out,vector<double,_std::allocator<double>_> *v)

{
  pointer pdVar1;
  ostream *poVar2;
  pointer pdVar3;
  ulong uVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
  pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if ((long)pdVar3 - (long)pdVar1 != 8) {
    uVar4 = 0;
    do {
      poVar2 = std::ostream::_M_insert<double>(pdVar1[uVar4]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      uVar4 = uVar4 + 1;
      pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    } while (uVar4 < ((long)pdVar3 - (long)pdVar1 >> 3) - 1U);
  }
  poVar2 = std::ostream::_M_insert<double>(pdVar3[-1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const std::vector<T> &v)
{
    out << "[";
    for (auto i = 0; i < v.size() - 1; i++)
    {
        out << v[i] << ", ";
    }
    out << v.back() << "]";

    return out;
}